

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

uint32_t __thiscall kratos::VarDuplicated::width(VarDuplicated *this)

{
  _func_int *p_Var1;
  int iVar2;
  undefined1 local_28 [8];
  shared_ptr<kratos::Const> count;
  
  Var::as<kratos::Const>((Var *)local_28);
  p_Var1 = *(_func_int **)((long)local_28 + 0x270);
  iVar2 = (*(((this->super_Expr).left)->super_IRNode)._vptr_IRNode[7])();
  if (count.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               count.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return iVar2 * (int)p_Var1;
}

Assistant:

uint32_t VarDuplicated::width() const {
    auto count = right->as<Const>();
    return static_cast<uint32_t>(count->value()) * left->width();
}